

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variable_modifier_suite.cpp
# Opt level: O3

void clear_suite::run(void)

{
  clear_null();
  clear_boolean();
  clear_integer();
  clear_real();
  clear_string();
  clear_wstring();
  clear_u16string();
  clear_u32string();
  clear_array();
  clear_map();
  return;
}

Assistant:

void run()
{
    clear_null();
    clear_boolean();
    clear_integer();
    clear_real();
    clear_string();
    clear_wstring();
    clear_u16string();
    clear_u32string();
    clear_array();
    clear_map();
}